

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

void Cba_BlastDivider2(Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,
                      Vec_Int_t *vRes)

{
  Gia_Man_t *pNew_00;
  int *__ptr;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 in_register_00000014;
  int *piVar4;
  int *piVar5;
  int a;
  ulong uVar6;
  ulong uVar7;
  int Carry_1;
  int Carry;
  undefined8 local_88;
  int local_7c;
  uint local_78;
  int Temp;
  Vec_Int_t *local_70;
  int *local_68;
  ulong local_60;
  int *local_58;
  Gia_Man_t *local_50;
  int *local_48;
  ulong local_40;
  ulong local_38;
  
  local_88 = CONCAT44(in_register_00000014,nNum);
  uVar6 = (ulong)(uint)nDiv;
  piVar4 = vRes->pArray;
  local_7c = fQuo;
  local_58 = pDiv;
  local_50 = pNew;
  local_48 = (int *)malloc((long)nNum * 4);
  if ((0 < nNum) && (0 < nDiv)) {
    uVar1 = (int)local_88 + nDiv;
    if (vRes->nSize < (int)uVar1) {
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        iVar2 = 0;
        if ((long)uVar3 < (long)nNum) {
          iVar2 = pNum[uVar3];
        }
        piVar4[uVar3] = iVar2;
      }
      local_70 = vRes;
      uVar1 = (int)local_88 - 1;
      local_78 = uVar1;
      local_68 = piVar4;
      local_40 = uVar6;
      while (__ptr = local_48, pNew_00 = local_50, piVar5 = local_68, uVar3 = (ulong)uVar1,
            -1 < (int)uVar1) {
        iVar2 = 1;
        if (uVar1 != local_78) {
          iVar2 = local_48[uVar3 + 1];
        }
        piVar5 = piVar4 + uVar3;
        Carry = iVar2;
        local_60 = uVar3;
        local_38 = uVar3;
        for (uVar7 = 0; uVar6 = local_40, piVar4 = local_68, nDiv + 1 != uVar7; uVar7 = uVar7 + 1) {
          a = 0;
          if (uVar7 < (uint)nDiv) {
            a = local_58[uVar7];
          }
          Cba_BlastFullAdderSubtr(local_50,a,*piVar5,Carry,&Carry,piVar5,iVar2);
          piVar5 = piVar5 + 1;
        }
        iVar2 = Abc_LitNot(local_68[(uint)((int)local_60 + (int)local_40)]);
        local_48[local_38] = iVar2;
        uVar1 = (int)local_60 - 1;
      }
      if (local_7c == 0) {
        Carry_1 = 0;
        for (uVar3 = 0; (uint)nDiv != uVar3; uVar3 = uVar3 + 1) {
          Cba_BlastFullAdder(pNew_00,local_58[uVar3],piVar5[uVar3],Carry_1,&Carry_1,&Temp);
          iVar2 = Gia_ManHashMux(pNew_00,*__ptr,piVar5[uVar3],Temp);
          piVar5[uVar3] = iVar2;
        }
        Vec_IntShrink(local_70,(int)uVar6);
      }
      else {
        Cba_VecCopy(local_70,local_48,(int)local_88);
      }
      free(__ptr);
      return;
    }
    __assert_fail("Vec_IntSize(vRes) < nNum + nDiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaBlast.c"
                  ,0x1b6,
                  "void Cba_BlastDivider2(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
  }
  __assert_fail("nNum > 0 && nDiv > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaBlast.c"
                ,0x1b5,
                "void Cba_BlastDivider2(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
}

Assistant:

void Cba_BlastDivider2( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    int i, * pRes  = Vec_IntArray(vRes);
    int k, * pQuo  = ABC_ALLOC( int, nNum );
    assert( nNum > 0 && nDiv > 0 );
    assert( Vec_IntSize(vRes) < nNum + nDiv );
    for ( i = 0; i < nNum + nDiv; i++ )
        pRes[i] = i < nNum ? pNum[i] : 0;
    for ( i = nNum-1; i >= 0; i-- )
    {
        int Cntrl = i == nNum-1 ? 1 : pQuo[i+1];
        int Carry = Cntrl;
        for ( k = 0; k <= nDiv; k++ )
            Cba_BlastFullAdderSubtr( pNew, k < nDiv ? pDiv[k] : 0, pRes[i+k], Carry, &Carry, &pRes[i+k], Cntrl );
        pQuo[i] = Abc_LitNot(pRes[i+nDiv]);
    }
    if ( fQuo )
        Cba_VecCopy( vRes, pQuo, nNum );
    else
    {
        int Carry = 0, Temp;
        for ( k = 0; k < nDiv; k++ )
        {
            Cba_BlastFullAdder( pNew, pDiv[k], pRes[k], Carry, &Carry, &Temp );
            pRes[k] = Gia_ManHashMux( pNew, pQuo[0], pRes[k], Temp );
        }
        Vec_IntShrink( vRes, nDiv );
    }
    ABC_FREE( pQuo );
}